

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imsg.c
# Opt level: O2

void imsg_close(imsgbuf *ibuf,ibuf *msg)

{
  ushort uVar1;
  u_char *puVar2;
  
  puVar2 = msg->buf;
  uVar1 = *(ushort *)(puVar2 + 6);
  *(ushort *)(puVar2 + 6) = uVar1 & 0xfffe;
  if (msg->fd != -1) {
    *(ushort *)(puVar2 + 6) = uVar1 | 1;
  }
  *(short *)(puVar2 + 4) = (short)msg->wpos;
  ibuf_close(&ibuf->w,msg);
  return;
}

Assistant:

void
imsg_close(struct imsgbuf *ibuf, struct ibuf *msg)
{
	struct imsg_hdr	*hdr;

	hdr = (struct imsg_hdr *)msg->buf;

	hdr->flags &= ~IMSGF_HASFD;
	if (msg->fd != -1)
		hdr->flags |= IMSGF_HASFD;

	hdr->len = (u_int16_t)msg->wpos;

	ibuf_close(&ibuf->w, msg);
}